

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equationofstateCmd.cpp
# Opt level: O0

char * gengetopt_strdup(char *s)

{
  size_t sVar1;
  char *in_RDI;
  char *result;
  undefined8 local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    local_8 = (char *)malloc(sVar1 + 1);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      strcpy(local_8,in_RDI);
    }
  }
  return local_8;
}

Assistant:

char *
gengetopt_strdup (const char *s)
{
  char *result = 0;
  if (!s)
    return result;

  result = (char*)malloc(strlen(s) + 1);
  if (result == (char*)0)
    return (char*)0;
  strcpy(result, s);
  return result;
}